

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O1

Ratio * __thiscall Ratio::reverse(Ratio *__return_storage_ptr__,Ratio *this)

{
  pointer pPVar1;
  PhyloTreeEdge *pPVar2;
  PhyloTreeEdge *e;
  pointer __args;
  PhyloTreeEdge *__args_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> fvec;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> evec;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_68;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_48;
  
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&local_48,
             ((long)(this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&local_68,
             ((long)(this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  __args = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != pPVar1) {
    do {
      std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
                ((vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&local_48,__args);
      __args = __args + 1;
    } while (__args != pPVar1);
  }
  pPVar2 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__args_00 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start; __args_00 != pPVar2;
      __args_00 = __args_00 + 1) {
    std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_back<PhyloTreeEdge&>
              ((vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&local_68,__args_00);
  }
  Ratio(__return_storage_ptr__,&local_68,&local_48);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_68);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Ratio Ratio::reverse() {
    vector<PhyloTreeEdge> evec, fvec;
    evec.reserve(eEdges.size());
    fvec.reserve(fEdges.size());
    for (auto &e : eEdges) {
        evec.emplace_back(e);
    }
    for (auto &f : fEdges) {
        fvec.emplace_back(f);
    }
    return Ratio(fvec, evec);
}